

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.h
# Opt level: O3

bool CoreML::Specification::operator==(WordTagger *a,WordTagger *b)

{
  string *psVar1;
  string *psVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  
  if (a->revision_ != b->revision_) {
    return false;
  }
  psVar1 = (a->language_).ptr_;
  psVar2 = (b->language_).ptr_;
  sVar3 = psVar1->_M_string_length;
  if ((sVar3 == psVar2->_M_string_length) &&
     ((sVar3 == 0 ||
      (iVar5 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3), iVar5 == 0)))) {
    psVar1 = (a->tokensoutputfeaturename_).ptr_;
    psVar2 = (b->tokensoutputfeaturename_).ptr_;
    sVar3 = psVar1->_M_string_length;
    if ((sVar3 == psVar2->_M_string_length) &&
       ((sVar3 == 0 ||
        (iVar5 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3), iVar5 == 0)))) {
      psVar1 = (a->tokentagsoutputfeaturename_).ptr_;
      psVar2 = (b->tokentagsoutputfeaturename_).ptr_;
      sVar3 = psVar1->_M_string_length;
      if ((sVar3 == psVar2->_M_string_length) &&
         ((sVar3 == 0 ||
          (iVar5 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3), iVar5 == 0))))
      {
        psVar1 = (a->tokenlocationsoutputfeaturename_).ptr_;
        psVar2 = (b->tokenlocationsoutputfeaturename_).ptr_;
        sVar3 = psVar1->_M_string_length;
        if ((sVar3 == psVar2->_M_string_length) &&
           ((sVar3 == 0 ||
            (iVar5 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3), iVar5 == 0))
           )) {
          psVar1 = (a->tokenlengthsoutputfeaturename_).ptr_;
          psVar2 = (b->tokenlengthsoutputfeaturename_).ptr_;
          sVar3 = psVar1->_M_string_length;
          if ((sVar3 == psVar2->_M_string_length) &&
             ((((sVar3 == 0 ||
                (iVar5 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3),
                iVar5 == 0)) && (a->_oneof_case_[0] == b->_oneof_case_[0])) &&
              ((a->_oneof_case_[0] != 200 ||
               (bVar4 = vectorsEqual<CoreML::Specification::StringVector>
                                  ((a->Tags_).stringtags_,(b->Tags_).stringtags_), bVar4)))))) {
            psVar1 = (a->modelparameterdata_).ptr_;
            sVar3 = psVar1->_M_string_length;
            psVar2 = (b->modelparameterdata_).ptr_;
            if ((sVar3 == psVar2->_M_string_length) &&
               ((sVar3 == 0 ||
                (iVar5 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3),
                iVar5 == 0)))) {
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

inline ::google::protobuf::uint32 WordTagger::revision() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.CoreMLModels.WordTagger.revision)
  return revision_;
}